

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O0

int SetDeviceCurrentState(char *szFilename,int bON)

{
  int iVar1;
  FILE *__stream;
  FILE *file;
  int bON_local;
  char *szFilename_local;
  
  __stream = fopen(szFilename,"w");
  if (__stream == (FILE *)0x0) {
    printf("Unable to create device current state file.\n");
    szFilename_local._4_4_ = 1;
  }
  else {
    iVar1 = fprintf(__stream,"%d",(ulong)(uint)bON);
    if (iVar1 < 1) {
      printf("Error writing device current state file.\n");
      fclose(__stream);
      szFilename_local._4_4_ = 1;
    }
    else {
      iVar1 = fclose(__stream);
      if (iVar1 == 0) {
        szFilename_local._4_4_ = 0;
      }
      else {
        printf("Error closing device current state file.\n");
        szFilename_local._4_4_ = 1;
      }
    }
  }
  return szFilename_local._4_4_;
}

Assistant:

int SetDeviceCurrentState(char* szFilename, int bON)
{

	// Should use an interprocess semaphore...

	FILE* file = NULL;

	file = fopen(szFilename, "w");
	if (file == NULL)
	{
		printf("Unable to create device current state file.\n");
		return EXIT_FAILURE;
	}
	if (fprintf(file, "%d", bON) <= 0)
	{
		printf("Error writing device current state file.\n");
		fclose(file);
		return EXIT_FAILURE;
	}
	if (fclose(file) != EXIT_SUCCESS)
	{
		printf("Error closing device current state file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}